

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::cftb1st(int n,double *a,double *w)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double local_b8;
  double local_a8;
  
  iVar7 = n >> 3;
  lVar4 = (long)(iVar7 * 2);
  dVar26 = a[lVar4];
  dVar27 = (a + lVar4)[1];
  dVar40 = a[iVar7 * 6];
  dVar29 = (a + iVar7 * 6)[1];
  dVar16 = dVar26 - dVar40;
  dVar18 = dVar27 - dVar29;
  dVar21 = a[iVar7 * 4];
  dVar20 = (a + iVar7 * 4)[1];
  dVar22 = *a + dVar21;
  dVar30 = -a[1] - dVar20;
  dVar20 = dVar20 - a[1];
  dVar21 = *a - dVar21;
  dVar26 = dVar26 + dVar40;
  dVar27 = dVar27 + dVar29;
  *a = dVar22 + dVar26;
  a[1] = dVar30 - dVar27;
  a[lVar4] = dVar22 - dVar26;
  (a + lVar4)[1] = dVar30 + dVar27;
  a[iVar7 * 4] = dVar21 + dVar18;
  (a + iVar7 * 4)[1] = dVar20 + dVar16;
  a[iVar7 * 6] = dVar21 - dVar18;
  (a + iVar7 * 6)[1] = dVar20 - dVar16;
  dVar26 = w[1];
  dVar27 = w[2];
  dVar40 = w[3];
  uVar3 = (ulong)(iVar7 - 2U);
  if (iVar7 < 5) {
    uVar3 = (ulong)(int)(iVar7 - 2U);
    dVar16 = 0.0;
    dVar20 = 1.0;
    dVar29 = 1.0;
    dVar21 = 0.0;
  }
  else {
    lVar8 = lVar4 + -1;
    lVar12 = lVar4 * 0x20 + -0x10;
    lVar5 = lVar4 + 2;
    lVar10 = lVar4 * 0x10 + 0x10;
    local_a8 = 0.0;
    local_b8 = 1.0;
    lVar14 = 4;
    dVar18 = 1.0;
    dVar22 = 0.0;
    lVar9 = lVar4 * 0x18;
    lVar2 = lVar4 * 0x18;
    lVar4 = lVar4 * 0x10;
    do {
      lVar11 = lVar4 + -0x20;
      lVar13 = lVar2 + 0x20;
      lVar6 = lVar9 + -0x20;
      dVar29 = w[lVar14 + 2];
      dVar33 = (dVar18 + dVar29) * dVar40;
      dVar21 = w[lVar14 + 3];
      dVar39 = (dVar22 + dVar21) * dVar40;
      dVar18 = *(double *)((long)a + lVar10 + 8);
      dVar36 = -a[lVar14 + -1] - dVar18;
      dVar32 = a[lVar14 + -2] + *(double *)((long)a + lVar10);
      dVar18 = dVar18 - a[lVar14 + -1];
      dVar28 = a[lVar14 + -2] - *(double *)((long)a + lVar10);
      dVar34 = a[lVar5];
      dVar35 = (a + lVar5)[1];
      pdVar1 = (double *)((long)a + lVar2 + 0x10);
      dVar20 = *pdVar1;
      dVar16 = pdVar1[1];
      dVar23 = dVar34 + dVar20;
      dVar24 = dVar35 + dVar16;
      dVar34 = dVar34 - dVar20;
      dVar35 = dVar35 - dVar16;
      dVar37 = dVar18 - dVar34;
      dVar38 = dVar28 - dVar35;
      dVar22 = *(double *)((long)a + lVar10 + 0x18);
      dVar43 = -a[lVar14 + 1] - dVar22;
      dVar30 = *(double *)((long)a + lVar10 + 0x10);
      dVar25 = a[lVar14] + dVar30;
      dVar22 = dVar22 - a[lVar14 + 1];
      dVar30 = a[lVar14] - dVar30;
      dVar17 = a[lVar5 + 2];
      dVar19 = (a + lVar5 + 2)[1];
      dVar20 = *(double *)((long)a + lVar13);
      dVar16 = ((double *)((long)a + lVar13))[1];
      dVar41 = dVar17 + dVar20;
      dVar42 = dVar19 + dVar16;
      dVar17 = dVar17 - dVar20;
      dVar19 = dVar19 - dVar16;
      dVar20 = w[lVar14];
      dVar16 = w[lVar14 + 1];
      a[lVar14 + -2] = dVar32 + dVar23;
      a[lVar14 + -1] = dVar36 - dVar24;
      a[lVar14] = dVar25 + dVar41;
      a[lVar14 + 1] = dVar43 - dVar42;
      a[lVar5] = dVar32 - dVar23;
      dVar44 = (local_b8 + dVar20) * dVar27;
      dVar31 = (local_a8 + dVar16) * dVar27;
      a[lVar5 + 1] = dVar24 + dVar36;
      a[lVar5 + 2] = dVar25 - dVar41;
      a[lVar5 + 3] = dVar42 + dVar43;
      dVar34 = dVar34 + dVar18;
      dVar35 = dVar35 + dVar28;
      *(double *)((long)a + lVar10) = dVar35 * dVar44 + -dVar31 * dVar34;
      ((double *)((long)a + lVar10))[1] = dVar34 * dVar44 + dVar31 * dVar35;
      dVar18 = dVar22 + dVar17;
      dVar34 = dVar30 + dVar19;
      pdVar1 = (double *)((long)a + lVar10 + 0x10);
      *pdVar1 = dVar34 * dVar20 + -dVar16 * dVar18;
      pdVar1[1] = dVar18 * dVar20 + dVar16 * dVar34;
      pdVar1 = (double *)((long)a + lVar2 + 0x10);
      *pdVar1 = dVar38 * dVar33 + dVar39 * dVar37;
      pdVar1[1] = dVar37 * dVar33 + -dVar39 * dVar38;
      dVar22 = dVar22 - dVar17;
      dVar30 = dVar30 - dVar19;
      *(double *)((long)a + lVar13) = dVar30 * dVar29 + dVar21 * dVar22;
      ((double *)((long)a + lVar13))[1] = dVar22 * dVar29 + -dVar21 * dVar30;
      dVar18 = *(double *)((long)a + lVar9 + -0x18);
      dVar38 = -a[lVar8 + -2] - dVar18;
      dVar36 = a[lVar8 + -3] + *(double *)((long)a + lVar6);
      dVar18 = dVar18 - a[lVar8 + -2];
      dVar37 = a[lVar8 + -3] - *(double *)((long)a + lVar6);
      dVar34 = *(double *)((long)a + lVar11);
      dVar35 = ((double *)((long)a + lVar11))[1];
      pdVar1 = (double *)((long)a + lVar12 + -0x10);
      dVar22 = *pdVar1;
      dVar30 = pdVar1[1];
      dVar28 = dVar34 + dVar22;
      dVar32 = dVar35 + dVar30;
      dVar34 = dVar34 - dVar22;
      dVar35 = dVar35 - dVar30;
      dVar22 = *(double *)((long)a + lVar9 + -8);
      dVar25 = -a[lVar8] - dVar22;
      dVar30 = *(double *)((long)a + lVar9 + -0x10);
      dVar41 = a[lVar8 + -1] + dVar30;
      dVar22 = dVar22 - a[lVar8];
      dVar30 = a[lVar8 + -1] - dVar30;
      pdVar1 = (double *)((long)a + lVar4 + -0x10);
      dVar17 = *pdVar1;
      dVar19 = pdVar1[1];
      dVar23 = *(double *)((long)a + lVar12);
      dVar24 = ((double *)((long)a + lVar12))[1];
      dVar42 = dVar17 + dVar23;
      dVar43 = dVar19 + dVar24;
      dVar17 = dVar17 - dVar23;
      dVar19 = dVar19 - dVar24;
      a[lVar8 + -1] = dVar41 + dVar42;
      a[lVar8] = dVar25 - dVar43;
      a[lVar8 + -3] = dVar36 + dVar28;
      a[lVar8 + -2] = dVar38 - dVar32;
      *(double *)((long)a + lVar4 + -0x10) = dVar41 - dVar42;
      *(double *)((long)a + lVar4 + -8) = dVar43 + dVar25;
      *(double *)((long)a + lVar11) = dVar36 - dVar28;
      *(double *)((long)a + lVar4 + -0x18) = dVar32 + dVar38;
      dVar23 = dVar22 - dVar17;
      dVar24 = dVar30 - dVar19;
      dVar17 = dVar17 + dVar22;
      dVar19 = dVar19 + dVar30;
      pdVar1 = (double *)((long)a + lVar9 + -0x10);
      *pdVar1 = dVar19 * dVar31 + -dVar44 * dVar17;
      pdVar1[1] = dVar17 * dVar31 + dVar44 * dVar19;
      dVar22 = dVar18 + dVar34;
      dVar30 = dVar37 + dVar35;
      *(double *)((long)a + lVar6) = dVar30 * dVar16 + -dVar20 * dVar22;
      ((double *)((long)a + lVar6))[1] = dVar22 * dVar16 + dVar20 * dVar30;
      *(double *)((long)a + lVar12) = dVar24 * dVar39 + dVar33 * dVar23;
      ((double *)((long)a + lVar12))[1] = dVar23 * dVar39 + -dVar33 * dVar24;
      dVar18 = dVar18 - dVar34;
      dVar37 = dVar37 - dVar35;
      pdVar1 = (double *)((long)a + lVar12 + -0x10);
      *pdVar1 = dVar37 * dVar21 + dVar29 * dVar18;
      pdVar1[1] = dVar18 * dVar21 + -dVar29 * dVar37;
      lVar8 = lVar8 + -4;
      lVar12 = lVar12 + -0x20;
      lVar5 = lVar5 + 4;
      lVar10 = lVar10 + 0x20;
      uVar15 = lVar14 + 2;
      lVar14 = lVar14 + 4;
      dVar18 = dVar29;
      dVar22 = dVar21;
      lVar9 = lVar6;
      lVar2 = lVar13;
      lVar4 = lVar11;
      local_b8 = dVar20;
      local_a8 = dVar16;
    } while (uVar15 < uVar3);
  }
  dVar23 = (dVar20 + dVar26) * dVar27;
  dVar27 = (dVar16 + dVar26) * dVar27;
  dVar19 = (dVar29 - dVar26) * dVar40;
  dVar40 = (dVar21 - dVar26) * dVar40;
  lVar8 = (long)(iVar7 * 5);
  dVar30 = -a[(long)iVar7 + -1] - a[lVar8 + -1];
  lVar9 = (long)(iVar7 * 3);
  lVar4 = (long)(iVar7 * 7);
  dVar34 = a[uVar3] + a[lVar8 + -2];
  dVar18 = a[lVar8 + -1] - a[(long)iVar7 + -1];
  dVar22 = a[uVar3] - a[lVar8 + -2];
  dVar29 = a[lVar9 + -2];
  dVar21 = (a + lVar9 + -2)[1];
  dVar20 = a[lVar4 + -2];
  dVar16 = (a + lVar4 + -2)[1];
  dVar35 = dVar29 + dVar20;
  dVar17 = dVar21 + dVar16;
  dVar29 = dVar29 - dVar20;
  dVar21 = dVar21 - dVar16;
  a[uVar3] = dVar34 + dVar35;
  a[(long)iVar7 + -1] = dVar30 - dVar17;
  a[lVar9 + -2] = dVar34 - dVar35;
  a[lVar9 + -1] = dVar17 + dVar30;
  dVar20 = dVar18 + dVar29;
  dVar16 = dVar22 + dVar21;
  a[lVar8 + -2] = dVar16 * dVar23 + -dVar27 * dVar20;
  (a + lVar8 + -2)[1] = dVar20 * dVar23 + dVar27 * dVar16;
  dVar18 = dVar18 - dVar29;
  dVar22 = dVar22 - dVar21;
  a[lVar4 + -2] = dVar22 * dVar19 + dVar40 * dVar18;
  (a + lVar4 + -2)[1] = dVar18 * dVar19 + -dVar40 * dVar22;
  dVar29 = a[iVar7] + a[lVar8];
  dVar22 = -a[(long)iVar7 + 1] - a[lVar8 + 1];
  dVar21 = a[iVar7] - a[lVar8];
  dVar16 = a[lVar8 + 1] - a[(long)iVar7 + 1];
  dVar30 = a[lVar9] + a[lVar4];
  dVar34 = a[lVar9 + 1] + a[lVar4 + 1];
  dVar20 = a[lVar9] - a[lVar4];
  dVar18 = a[lVar9 + 1] - a[lVar4 + 1];
  a[iVar7] = dVar29 + dVar30;
  a[(long)iVar7 + 1] = dVar22 - dVar34;
  a[lVar9] = dVar29 - dVar30;
  a[lVar9 + 1] = dVar34 + dVar22;
  dVar29 = dVar21 + dVar18;
  dVar22 = dVar16 + dVar20;
  a[lVar8] = (dVar29 - dVar22) * dVar26;
  a[lVar8 + 1] = (dVar22 + dVar29) * dVar26;
  dVar21 = dVar21 - dVar18;
  dVar16 = dVar16 - dVar20;
  a[lVar4] = (dVar16 + dVar21) * -dVar26;
  a[lVar4 + 1] = (dVar16 - dVar21) * -dVar26;
  dVar30 = -a[(long)iVar7 + 3] - a[lVar8 + 3];
  dVar22 = a[(long)iVar7 + 2] + a[lVar8 + 2];
  dVar16 = a[lVar8 + 3] - a[(long)iVar7 + 3];
  dVar18 = a[(long)iVar7 + 2] - a[lVar8 + 2];
  dVar26 = a[lVar9 + 2];
  dVar29 = (a + lVar9 + 2)[1];
  dVar21 = a[lVar4 + 2];
  dVar20 = (a + lVar4 + 2)[1];
  dVar34 = dVar26 + dVar21;
  dVar35 = dVar29 + dVar20;
  dVar26 = dVar26 - dVar21;
  dVar29 = dVar29 - dVar20;
  a[(long)iVar7 + 2] = dVar22 + dVar34;
  a[(long)iVar7 + 3] = dVar30 - dVar35;
  a[lVar9 + 2] = dVar22 - dVar34;
  a[lVar9 + 3] = dVar35 + dVar30;
  dVar21 = dVar16 + dVar26;
  dVar20 = dVar18 + dVar29;
  a[lVar8 + 2] = dVar20 * dVar27 + -dVar23 * dVar21;
  (a + lVar8 + 2)[1] = dVar21 * dVar27 + dVar23 * dVar20;
  dVar16 = dVar16 - dVar26;
  dVar18 = dVar18 - dVar29;
  a[lVar4 + 2] = dVar18 * dVar40 + dVar19 * dVar16;
  (a + lVar4 + 2)[1] = dVar16 * dVar40 + -dVar19 * dVar18;
  return;
}

Assistant:

void cftb1st(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
    wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = -a[1] - a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = -a[1] + a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i - x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i + x2i;
  a[j2] = x1r + x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r - x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  csc1 = w[2];
  csc3 = w[3];
  wd1r = 1;
  wd1i = 0;
  wd3r = 1;
  wd3i = 0;
  k = 0;
  for (j = 2; j < mh - 2; j += 4) {
    k += 4;
    wk1r = csc1 * (wd1r + w[k]);
    wk1i = csc1 * (wd1i + w[k + 1]);
    wk3r = csc3 * (wd3r + w[k + 2]);
    wk3i = csc3 * (wd3i + w[k + 3]);
    wd1r = w[k];
    wd1i = w[k + 1];
    wd3r = w[k + 2];
    wd3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = -a[j + 1] - a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = -a[j + 1] + a[j2 + 1];
    y0r = a[j + 2] + a[j2 + 2];
    y0i = -a[j + 3] - a[j2 + 3];
    y1r = a[j + 2] - a[j2 + 2];
    y1i = -a[j + 3] + a[j2 + 3];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 + 2] + a[j3 + 2];
    y2i = a[j1 + 3] + a[j3 + 3];
    y3r = a[j1 + 2] - a[j3 + 2];
    y3i = a[j1 + 3] - a[j3 + 3];
    a[j] = x0r + x2r;
    a[j + 1] = x0i - x2i;
    a[j + 2] = y0r + y2r;
    a[j + 3] = y0i - y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j1 + 2] = y0r - y2r;
    a[j1 + 3] = y0i + y2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = y1r + y3i;
    x0i = y1i + y3r;
    a[j2 + 2] = wd1r * x0r - wd1i * x0i;
    a[j2 + 3] = wd1r * x0i + wd1i * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    x0r = y1r - y3i;
    x0i = y1i - y3r;
    a[j3 + 2] = wd3r * x0r + wd3i * x0i;
    a[j3 + 3] = wd3r * x0i - wd3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = -a[j0 + 1] - a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = -a[j0 + 1] + a[j2 + 1];
    y0r = a[j0 - 2] + a[j2 - 2];
    y0i = -a[j0 - 1] - a[j2 - 1];
    y1r = a[j0 - 2] - a[j2 - 2];
    y1i = -a[j0 - 1] + a[j2 - 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 - 2] + a[j3 - 2];
    y2i = a[j1 - 1] + a[j3 - 1];
    y3r = a[j1 - 2] - a[j3 - 2];
    y3i = a[j1 - 1] - a[j3 - 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i - x2i;
    a[j0 - 2] = y0r + y2r;
    a[j0 - 1] = y0i - y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j1 - 2] = y0r - y2r;
    a[j1 - 1] = y0i + y2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = y1r + y3i;
    x0i = y1i + y3r;
    a[j2 - 2] = wd1i * x0r - wd1r * x0i;
    a[j2 - 1] = wd1i * x0i + wd1r * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
    x0r = y1r - y3i;
    x0i = y1i - y3r;
    a[j3 - 2] = wd3i * x0r + wd3r * x0i;
    a[j3 - 1] = wd3i * x0i - wd3r * x0r;
  }
  wk1r = csc1 * (wd1r + wn4r);
  wk1i = csc1 * (wd1i + wn4r);
  wk3r = csc3 * (wd3r - wn4r);
  wk3i = csc3 * (wd3i - wn4r);
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0 - 2] + a[j2 - 2];
  x0i = -a[j0 - 1] - a[j2 - 1];
  x1r = a[j0 - 2] - a[j2 - 2];
  x1i = -a[j0 - 1] + a[j2 - 1];
  x2r = a[j1 - 2] + a[j3 - 2];
  x2i = a[j1 - 1] + a[j3 - 1];
  x3r = a[j1 - 2] - a[j3 - 2];
  x3i = a[j1 - 1] - a[j3 - 1];
  a[j0 - 2] = x0r + x2r;
  a[j0 - 1] = x0i - x2i;
  a[j1 - 2] = x0r - x2r;
  a[j1 - 1] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2 - 2] = wk1r * x0r - wk1i * x0i;
  a[j2 - 1] = wk1r * x0i + wk1i * x0r;
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3 - 2] = wk3r * x0r + wk3i * x0i;
  a[j3 - 1] = wk3r * x0i - wk3i * x0r;
  x0r = a[j0] + a[j2];
  x0i = -a[j0 + 1] - a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = -a[j0 + 1] + a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i - x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
  x0r = a[j0 + 2] + a[j2 + 2];
  x0i = -a[j0 + 3] - a[j2 + 3];
  x1r = a[j0 + 2] - a[j2 + 2];
  x1i = -a[j0 + 3] + a[j2 + 3];
  x2r = a[j1 + 2] + a[j3 + 2];
  x2i = a[j1 + 3] + a[j3 + 3];
  x3r = a[j1 + 2] - a[j3 + 2];
  x3i = a[j1 + 3] - a[j3 + 3];
  a[j0 + 2] = x0r + x2r;
  a[j0 + 3] = x0i - x2i;
  a[j1 + 2] = x0r - x2r;
  a[j1 + 3] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2 + 2] = wk1i * x0r - wk1r * x0i;
  a[j2 + 3] = wk1i * x0i + wk1r * x0r;
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3 + 2] = wk3i * x0r + wk3r * x0i;
  a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}